

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O1

string * __thiscall
iutest::detail::StringFormat_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,char *format,__va_list_tag *va)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *__s;
  int *piVar4;
  ulong __maxlen;
  va_list va2;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  sVar3 = strlen((char *)this);
  local_38 = *(undefined8 *)(format + 0x10);
  local_48 = *(undefined8 *)format;
  uStack_40 = *(undefined8 *)(format + 8);
  iVar1 = vsnprintf((char *)0x0,0,(char *)this,&local_48);
  __maxlen = (ulong)(iVar1 + 1);
  if (iVar1 < 1) {
    __maxlen = sVar3 * 2 + 1;
  }
  do {
    __s = (char *)operator_new__(__maxlen);
    local_38 = *(undefined8 *)(format + 0x10);
    local_48 = *(undefined8 *)format;
    uStack_40 = *(undefined8 *)(format + 8);
    uVar2 = vsnprintf(__s,__maxlen,(char *)this,&local_48);
    if ((int)uVar2 < 0) {
      piVar4 = __errno_location();
      iVar1 = 2;
      if ((*piVar4 != 7) && (*piVar4 != 0x4b)) goto LAB_001183cd;
    }
    else if (uVar2 < __maxlen) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,__s,__s + uVar2);
      operator_delete__(__s);
      iVar1 = 1;
    }
    else {
LAB_001183cd:
      operator_delete__(__s);
      __maxlen = __maxlen * 2;
      iVar1 = 0;
    }
    if (iVar1 != 0) {
      if (iVar1 == 2) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

inline ::std::string StringFormat(const char* format, va_list va)
{
    size_t n = strlen(format) * 2 + 1;
    {
        va_list va2;
        iu_va_copy(va2, va);    // cppcheck-suppress va_list_usedBeforeStarted
        const int ret = iu_vsnprintf(NULL, 0u, format, va2);
        va_end(va2);
        if( ret > 0 )
        {
            n = static_cast<size_t>(ret + 1);
        }
    }
    for( ;; )
    {
        char* dst = new char[n];
        va_list va2;
        iu_va_copy(va2, va);    // cppcheck-suppress va_list_usedBeforeStarted
        const int written = iu_vsnprintf(dst, n, format, va2);
        va_end(va2);
        if( written < 0 )
        {
#if defined(EOVERFLOW)
            if( errno == EOVERFLOW )
            {
                break;
            }
#endif
#if defined(E2BIG)
            if( errno == E2BIG )
            {
                break;
            }
#endif
        }
        else if( static_cast<size_t>(written) < n )
        {
            ::std::string s = ::std::string(dst, static_cast<size_t>(written));
            delete[] dst;
            return s;
        }
        delete[] dst;
        n *= 2;
    }
    return "";
}